

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O2

void wiz_play_item_standard_upkeep(player *p,object *obj)

{
  ulong uVar1;
  player_upkeep *ppVar2;
  _Bool _Var3;
  uint uVar4;
  
  _Var3 = object_is_carried(p,obj);
  ppVar2 = p->upkeep;
  uVar4 = 0x800000;
  if (_Var3) {
    uVar1._0_4_ = ppVar2->notice;
    uVar1._4_4_ = ppVar2->update;
    ppVar2->notice = (int)(uVar1 | 0x20100000001);
    ppVar2->update = (int)((uVar1 | 0x20100000001) >> 0x20);
    uVar4 = 0x60000;
  }
  ppVar2->redraw = ppVar2->redraw | uVar4;
  return;
}

Assistant:

static void wiz_play_item_standard_upkeep(struct player *p, struct object *obj)
{
	if (object_is_carried(p, obj)) {
		p->upkeep->update |= (PU_BONUS | PU_INVEN);
		p->upkeep->notice |= (PN_COMBINE);
		p->upkeep->redraw |= (PR_INVEN | PR_EQUIP);
	} else {
		p->upkeep->redraw |= (PR_ITEMLIST);
	}
}